

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

int __thiscall
dynamicgraph::
Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::access
          (Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,char *__name,int __type)

{
  Mutex *ppiVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined4 in_register_00000014;
  
  if (this->signalType - REFERENCE < 2) {
    ppiVar1 = this->providerMutex;
    this->copyInit = true;
    (this->super_SignalBase<int>).signalTime = *(int *)__name;
    if (ppiVar1 == (Mutex *)0x0) {
      pbVar4 = setTcopy(this,this->Treference);
      return (int)pbVar4;
    }
    pbVar3 = setTcopy(this,this->Treference);
  }
  else {
    if (this->signalType != FUNCTION) {
      if ((this->super_SignalBase<int>).ready == true) {
        (this->super_SignalBase<int>).ready = false;
        (*(this->super_SignalBase<int>)._vptr_SignalBase[3])
                  (this,__name,CONCAT44(in_register_00000014,__type));
      }
      iVar2 = (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1d])(this);
      return iVar2;
    }
    pbVar4 = &this->Tcopy1;
    pbVar3 = pbVar4;
    if (this->Tcopy == pbVar4) {
      pbVar3 = &this->Tcopy2;
    }
    ppiVar1 = this->providerMutex;
    iVar2 = *(int *)__name;
    (this->super_SignalBase<int>).signalTime = iVar2;
    if (ppiVar1 == (Mutex *)0x0) {
      boost::
      function2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int>
      ::operator()(&this->Tfunction,pbVar3,iVar2);
    }
    else {
      boost::
      function2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int>
      ::operator()(&this->Tfunction,pbVar3,iVar2);
    }
    this->copyInit = true;
    pbVar3 = &this->Tcopy2;
    if (this->Tcopy != pbVar4) {
      pbVar3 = pbVar4;
    }
    this->Tcopy = pbVar3;
  }
  return (int)pbVar3;
}

Assistant:

const T &Signal<T, Time>::access(const Time &t) {
  switch (signalType) {
    case REFERENCE:
    case REFERENCE_NON_CONST: {
      if (NULL == providerMutex) {
        copyInit = true;
        signalTime = t;
        return setTcopy(*Treference);
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          copyInit = true;
          signalTime = t;
          return setTcopy(*Treference);
        } catch (const MutexError &) {
          return accessCopy();
        }
      }

      break;
    }

    case FUNCTION: {
      if (NULL == providerMutex) {
        signalTime = t;
        Tfunction(getTwork(), t);
        copyInit = true;
        return switchTcopy();
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          signalTime = t;
          Tfunction(getTwork(), t);
          copyInit = true;
          return switchTcopy();
        } catch (const MutexError &) {
          return accessCopy();
        }
      }
      break;
    }
    case CONSTANT:
    default:
      if (this->getReady()) {
        setReady(false);
        this->setTime(t);
      }
      return accessCopy();
  };
}